

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O1

void __thiscall antlr::TreeParser::reportError(TreeParser *this,RecognitionException *ex)

{
  long *plVar1;
  size_t sVar2;
  long *local_28 [2];
  long local_18 [2];
  
  (*(ex->super_ANTLRException)._vptr_ANTLRException[2])(local_28);
  plVar1 = local_28[0];
  if (local_28[0] == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x30b6c0);
  }
  else {
    sVar2 = strlen((char *)local_28[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)plVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  return;
}

Assistant:

void TreeParser::reportError(const RecognitionException& ex)
{
	ANTLR_USE_NAMESPACE(std)cerr << ex.toString().c_str() << ANTLR_USE_NAMESPACE(std)endl;
}